

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

unsigned_long util::long_rand(void)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = ::rand();
  uVar2 = ::rand();
  return (long)(int)(uVar1 & 0xffff) << 0x10 | (long)(int)(uVar2 & 0xffff);
}

Assistant:

static unsigned long long_rand()
{
	typedef unsigned long ul;
#if RAND_MAX < 65535
	return ul(std::rand() & 0xFF) << 24 | ul(std::rand() & 0xFF) << 16 | ul(std::rand() & 0xFF) << 8 | ul(std::rand() & 0xFF);
#else
#if RAND_MAX < 4294967295
	return ul(std::rand() & 0xFFFF) << 16 | ul(std::rand() & 0xFFFF);
#else
	return ul(std::rand() & 0xFFFFFFFFU);
#endif
#endif
}